

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckEqualSucceedsOnEqual::TestCheckEqualSucceedsOnEqual
          (TestCheckEqualSucceedsOnEqual *this)

{
  char *suiteName;
  TestCheckEqualSucceedsOnEqual *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckEqualSucceedsOnEqual",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x60);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestCheckEqualSucceedsOnEqual_00182d80;
  return;
}

Assistant:

TEST(CheckEqualSucceedsOnEqual)
{
    bool failure = true;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_EQUAL(1, 1);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(!failure);
}